

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::IfcLaborResource(IfcLaborResource *this)

{
  *(undefined ***)&this->field_0x1b0 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  *(char **)&this->field_0x1c0 = "IfcLaborResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00761a00);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x7618f8;
  *(undefined8 *)&this->field_0x1b0 = 0x7619e8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x761920;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x761948;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x761970;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x761998;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x7619c0;
  *(undefined1 **)&(this->super_IfcConstructionResource).field_0x188 = &this->field_0x198;
  *(undefined8 *)&this->field_0x190 = 0;
  this->field_0x198 = 0;
  this->field_0x1a8 = 0;
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}